

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

Expr product_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                    Expr *args,int argc)

{
  Expr *__ptr;
  Expr EVar1;
  Expr EVar2;
  Expr b;
  int local_4c;
  int i;
  Expr *values;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr num;
  
  if (argc == 0) {
    EVar1 = make_int_one(exec);
    num._0_8_ = EVar1.field_1;
    exec_local = (pExecutor)(ulong)EVar1.type;
  }
  else {
    __ptr = exec_eval_each(exec,callContext,args,argc);
    exec_local = *(pExecutor *)__ptr;
    num._0_8_ = __ptr->field_1;
    for (local_4c = 1; local_4c < argc; local_4c = local_4c + 1) {
      EVar1._0_8_ = (ulong)exec_local & 0xffffffff;
      b._4_4_ = 0;
      b.type = __ptr[local_4c].type;
      EVar1.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)num._0_8_;
      b.field_1.val_atom = __ptr[local_4c].field_1.val_atom;
      EVar1 = exec_product(exec,EVar1,b);
      num._0_8_ = EVar1.field_1;
      exec_local = (pExecutor)(ulong)EVar1.type;
    }
    free(__ptr);
  }
  EVar2._0_8_ = (ulong)exec_local & 0xffffffff;
  EVar2.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)num._0_8_;
  return EVar2;
}

Assistant:

BUILTIN_FUNC(product_builtin)
{
    if (argc == 0)
        return make_int_one(exec);

    Expr *values = exec_eval_each(exec, callContext, args, argc);

    Expr num = values[0];
    for (int i = 1; i < argc; i++)
        num = exec_product(exec, num, values[i]);

    free(values);
    return num;
}